

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O1

void Wlc_BlastRotateLeft(Gia_Man_t *pNew,int *pNum,int nNum,int *pShift,int nShift,Vec_Int_t *vRes)

{
  int *piVar1;
  int iVar2;
  void *__ptr;
  ulong uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong local_60;
  
  vRes->nSize = 0;
  uVar6 = (ulong)(uint)nNum;
  if (0 < nNum) {
    uVar3 = 0;
    do {
      Vec_IntPush(vRes,pNum[uVar3]);
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  __ptr = malloc((long)nNum << 2);
  if (0x20 < nShift) {
    __assert_fail("nShift <= 32",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/wlc/wlcBlast.c"
                  ,0xcc,"void Wlc_BlastRotateLeft(Gia_Man_t *, int *, int, int *, int, Vec_Int_t *)"
                 );
  }
  if (0 < nShift) {
    local_60 = 0;
    do {
      if (0 < nNum) {
        piVar1 = vRes->pArray;
        iVar4 = 1 << ((byte)local_60 & 0x1f);
        uVar3 = 0;
        iVar5 = iVar4;
        do {
          if ((long)uVar3 < (long)iVar4) {
            iVar2 = nNum - iVar5 % nNum;
          }
          else {
            iVar2 = (int)uVar3 - iVar4;
          }
          iVar2 = Gia_ManHashMux(pNew,pShift[local_60],piVar1[iVar2 % nNum],piVar1[uVar3]);
          *(int *)((long)__ptr + uVar3 * 4) = iVar2;
          uVar3 = uVar3 + 1;
          iVar5 = iVar5 + -1;
        } while (uVar6 != uVar3);
      }
      vRes->nSize = 0;
      if (0 < nNum) {
        uVar3 = 0;
        do {
          Vec_IntPush(vRes,*(int *)((long)__ptr + uVar3 * 4));
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      local_60 = local_60 + 1;
    } while (local_60 != (uint)nShift);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Wlc_BlastRotateLeft( Gia_Man_t * pNew, int * pNum, int nNum, int * pShift, int nShift, Vec_Int_t * vRes )
{
    int * pRes = Wlc_VecCopy( vRes, pNum, nNum );
    int i, j, * pTemp = ABC_ALLOC( int, nNum );
    assert( nShift <= 32 );
    for( i = 0; i < nShift; i++, pRes = Wlc_VecCopy(vRes, pTemp, nNum) ) 
        for( j = 0; j < nNum; j++ ) 
        {
            int move = (j >= (1<<i)) ? (j-(1<<i))%nNum : (nNum - (((1<<i)-j)%nNum)) % nNum;
            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[move], pRes[j] );
//            pTemp[j] = Gia_ManHashMux( pNew, pShift[i], pRes[((unsigned)(nNum-(1<<i)+j))%nNum], pRes[j] );
        }
    ABC_FREE( pTemp );
}